

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMUMPU9250.cpp
# Opt level: O1

bool __thiscall RTIMUMPU9250::IMUInit(RTIMUMPU9250 *this)

{
  uint uVar1;
  RTIMUSettings *pRVar2;
  bool bVar3;
  int iVar4;
  undefined8 in_RAX;
  undefined4 extraout_var;
  uchar result;
  uchar local_11;
  
  local_11 = (uchar)((ulong)in_RAX >> 0x38);
  this->m_firstTime = true;
  this->m_cacheCount = 0;
  this->m_cacheIn = 0;
  this->m_cacheOut = 0;
  (this->super_RTIMU).m_imuData.fusionPoseValid = false;
  (this->super_RTIMU).m_imuData.fusionQPoseValid = false;
  (this->super_RTIMU).m_imuData.gyroValid = true;
  (this->super_RTIMU).m_imuData.accelValid = true;
  (this->super_RTIMU).m_imuData.compassValid = true;
  (this->super_RTIMU).m_imuData.pressureValid = false;
  (this->super_RTIMU).m_imuData.temperatureValid = false;
  (this->super_RTIMU).m_imuData.humidityValid = false;
  pRVar2 = (this->super_RTIMU).m_settings;
  this->m_slaveAddr = pRVar2->m_I2CSlaveAddress;
  setSampleRate(this,pRVar2->m_MPU9250GyroAccelSampleRate);
  iVar4 = ((this->super_RTIMU).m_settings)->m_MPU9250CompassSampleRate;
  if (iVar4 - 1U < 100) {
    this->m_compassRate = iVar4;
  }
  else {
    fprintf(_stderr,"Illegal compass rate %d\n");
  }
  uVar1 = ((this->super_RTIMU).m_settings)->m_MPU9250GyroLpf;
  if (((byte)uVar1 < 7) || ((uVar1 & 0xff) - 0x10 < 2)) {
    this->m_gyroLpf = (byte)uVar1;
  }
  else {
    IMUInit((RTIMUMPU9250 *)(ulong)uVar1);
  }
  uVar1 = ((this->super_RTIMU).m_settings)->m_MPU9250AccelLpf;
  if (((byte)uVar1 < 7) || ((uVar1 & 0xff) == 8)) {
    this->m_accelLpf = (byte)uVar1;
  }
  else {
    IMUInit((RTIMUMPU9250 *)(ulong)uVar1);
  }
  setGyroFsr(this,(uchar)((this->super_RTIMU).m_settings)->m_MPU9250GyroFsr);
  setAccelFsr(this,(uchar)((this->super_RTIMU).m_settings)->m_MPU9250AccelFsr);
  RTIMU::setCalibrationData(&this->super_RTIMU);
  bVar3 = RTIMUHal::HALOpen(&((this->super_RTIMU).m_settings)->super_RTIMUHal);
  if ((bVar3) &&
     (bVar3 = RTIMUHal::HALWrite(&((this->super_RTIMU).m_settings)->super_RTIMUHal,this->m_slaveAddr
                                 ,'k',0x80,"Failed to initiate MPU9250 reset"), bVar3)) {
    RTIMUHal::delayMs(&((this->super_RTIMU).m_settings)->super_RTIMUHal,100);
    bVar3 = RTIMUHal::HALWrite(&((this->super_RTIMU).m_settings)->super_RTIMUHal,this->m_slaveAddr,
                               'k','\0',"Failed to stop MPU9250 reset");
    if (!bVar3) {
      return false;
    }
    bVar3 = RTIMUHal::HALRead(&((this->super_RTIMU).m_settings)->super_RTIMUHal,this->m_slaveAddr,
                              'u','\x01',&local_11,"Failed to read MPU9250 id");
    if (bVar3) {
      if (local_11 == 'q') {
        bVar3 = setGyroConfig(this);
        if ((((bVar3) && (bVar3 = setAccelConfig(this), bVar3)) &&
            (bVar3 = setSampleRate(this), bVar3)) &&
           (((bVar3 = compassSetup(this), bVar3 && (bVar3 = setCompassRate(this), bVar3)) &&
            (bVar3 = RTIMUHal::HALWrite(&((this->super_RTIMU).m_settings)->super_RTIMUHal,
                                        this->m_slaveAddr,'k','\x01',"Failed to set pwr_mgmt_1"),
            bVar3)))) {
          bVar3 = RTIMUHal::HALWrite(&((this->super_RTIMU).m_settings)->super_RTIMUHal,
                                     this->m_slaveAddr,'l','\0',"Failed to set pwr_mgmt_2");
          if (!bVar3) {
            return false;
          }
          bVar3 = resetFifo(this);
          if (bVar3) {
            RTIMU::gyroBiasInit(&this->super_RTIMU);
            iVar4 = (*(this->super_RTIMU)._vptr_RTIMU[2])(this);
            printf("%s init complete\n",CONCAT44(extraout_var,iVar4));
            fflush(_stdout);
            return true;
          }
        }
      }
      else {
        IMUInit();
      }
    }
  }
  return false;
}

Assistant:

bool RTIMUMPU9250::IMUInit()
{
    unsigned char result;

    m_firstTime = true;

#ifdef MPU9250_CACHE_MODE
    m_cacheIn = m_cacheOut = m_cacheCount = 0;
#endif

    // set validity flags

    m_imuData.fusionPoseValid = false;
    m_imuData.fusionQPoseValid = false;
    m_imuData.gyroValid = true;
    m_imuData.accelValid = true;
    m_imuData.compassValid = true;
    m_imuData.pressureValid = false;
    m_imuData.temperatureValid = false;
    m_imuData.humidityValid = false;

    //  configure IMU

    m_slaveAddr = m_settings->m_I2CSlaveAddress;

    setSampleRate(m_settings->m_MPU9250GyroAccelSampleRate);
    setCompassRate(m_settings->m_MPU9250CompassSampleRate);
    setGyroLpf(m_settings->m_MPU9250GyroLpf);
    setAccelLpf(m_settings->m_MPU9250AccelLpf);
    setGyroFsr(m_settings->m_MPU9250GyroFsr);
    setAccelFsr(m_settings->m_MPU9250AccelFsr);

    setCalibrationData();


    //  enable the bus

    if (!m_settings->HALOpen())
        return false;

    //  reset the MPU9250

    if (!m_settings->HALWrite(m_slaveAddr, MPU9250_PWR_MGMT_1, 0x80, "Failed to initiate MPU9250 reset"))
        return false;

    m_settings->delayMs(100);

    if (!m_settings->HALWrite(m_slaveAddr, MPU9250_PWR_MGMT_1, 0x00, "Failed to stop MPU9250 reset"))
        return false;

    if (!m_settings->HALRead(m_slaveAddr, MPU9250_WHO_AM_I, 1, &result, "Failed to read MPU9250 id"))
        return false;

    if (result != MPU9250_ID) {
        HAL_ERROR2("Incorrect %s id %d\n", IMUName(), result);
        return false;
    }

    //  now configure the various components

    if (!setGyroConfig())
        return false;

    if (!setAccelConfig())
        return false;

    if (!setSampleRate())
        return false;

    if(!compassSetup()) {
        return false;
    }

    if (!setCompassRate())
        return false;

    //  enable the sensors

    if (!m_settings->HALWrite(m_slaveAddr, MPU9250_PWR_MGMT_1, 1, "Failed to set pwr_mgmt_1"))
        return false;

    if (!m_settings->HALWrite(m_slaveAddr, MPU9250_PWR_MGMT_2, 0, "Failed to set pwr_mgmt_2"))
         return false;

    //  select the data to go into the FIFO and enable

    if (!resetFifo())
        return false;

    gyroBiasInit();

    HAL_INFO1("%s init complete\n", IMUName());
    return true;
}